

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser_bindings.cpp
# Opt level: O2

PyObject * PyInit_pytourn(void)

{
  module_ obj;
  int iVar1;
  char *__s1;
  module_ m;
  cpp_function func;
  handle local_48;
  object local_40;
  accessor<pybind11::detail::accessor_policies::str_attr> local_38;
  
  __s1 = (char *)Py_GetVersion();
  iVar1 = strncmp(__s1,"3.10",4);
  if ((iVar1 == 0) && (9 < (byte)(__s1[4] - 0x30U))) {
    pybind11::detail::get_internals();
    pybind11::module_::create_extension_module
              (&m,"pytourn",(char *)0x0,&pybind11_module_def_pytourn);
    local_38.obj.m_ptr = (PyObject *)m.super_object.super_handle.m_ptr;
    local_38.key = "__doc__";
    local_38.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
    pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::operator=
              (&local_38,(char (*) [30])"Python interface for tournser");
    pybind11::object::~object(&local_38.cache);
    obj = m;
    pybind11::none::none((none *)&local_48);
    pybind11::getattr((pybind11 *)&local_40,(handle)obj.super_object.super_handle.m_ptr,
                      "run_tournser",local_48);
    func.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
    pybind11::cpp_function::make_function_record((cpp_function *)&local_38);
    ((PyObject *)(local_38._0_8_ + 0x30))->ob_refcnt =
         (Py_ssize_t)
         pybind11::cpp_function::
         initialize<pybind11_init_pytourn(pybind11::module_&)::$_0,pybind11::dict,std::vector<int,std::allocator<int>>&,std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>&,char*,bool,unsigned_int,bool,bool,char*,pybind11::name,pybind11::scope,pybind11::sibling>(pybind11_init_pytourn(pybind11::module_&)::$_0&&,pybind11::dict(*)(std::vector<int,std::allocator<int>>&,std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>&,char*,bool,unsigned_int,bool,bool,char*),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&)
         ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
    *(undefined2 *)(local_38._0_8_ + 0x5c) = 8;
    *(byte *)(local_38._0_8_ + 0x59) = *(byte *)(local_38._0_8_ + 0x59) & 0x9f;
    *(char **)local_38._0_8_ = "run_tournser";
    *(object *)(local_38._0_8_ + 0x68) = obj.super_object.super_handle.m_ptr;
    ((PyObject *)(local_38._0_8_ + 0x70))->ob_refcnt = (Py_ssize_t)local_40.super_handle.m_ptr;
    pybind11::cpp_function::initialize_generic
              (&func,(unique_function_record *)&local_38,
               "({List[int]}, {List[List[float]]}, {str}, {bool}, {int}, {bool}, {bool}, {str}) -> %"
               ,(type_info **)
                pybind11::cpp_function::
                initialize<pybind11_init_pytourn(pybind11::module_&)::$_0,pybind11::dict,std::vector<int,std::allocator<int>>&,std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>&,char*,bool,unsigned_int,bool,bool,char*,pybind11::name,pybind11::scope,pybind11::sibling>(pybind11_init_pytourn(pybind11::module_&)::$_0&&,pybind11::dict(*)(std::vector<int,std::allocator<int>>&,std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>&,char*,bool,unsigned_int,bool,bool,char*),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&)
                ::types,8);
    std::
    unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
    ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                   *)&local_38);
    pybind11::object::~object(&local_40);
    pybind11::object::~object((object *)&local_48);
    pybind11::module_::add_object
              (&m,"run_tournser",(handle)func.super_function.super_object.super_handle.m_ptr,true);
    pybind11::object::~object((object *)&func);
    pybind11::object::~object(&m.super_object);
  }
  else {
    PyErr_Format(_PyExc_ImportError,
                 "Python version mismatch: module was compiled for Python %s, but the interpreter version is incompatible: %s."
                 ,"3.10",__s1);
    m.super_object.super_handle.m_ptr = (object)(object)(PyObject *)0x0;
  }
  return (PyObject *)m.super_object.super_handle.m_ptr;
}

Assistant:

PYBIND11_MODULE(pytourn, m) {

  m.doc() = "Python interface for tournser";

  m.def("run_tournser", [](std::vector<int>& vertices, std::vector<std::vector<value_t>>& edges,
                                char* filter, bool approx, uint32_t approx_val,
                                bool count_only, bool in_file, char* filename) {

    // Save std::cout status and disable
    auto cout_buff = std::cout.rdbuf();
    std::cout.rdbuf(nullptr);

    std::vector<size_t> cell_counts;
    py::dict output;
    delta_complex_t complex = delta_complex_t();

    //initialise approximate functionality
    size_t max_entries = std::numeric_limits<size_t>::max();
    if (approx) max_entries = approx_val;

    bool dist = false;
    if(in_file){
        complex = read_graph(filename,filter,dist);
    } else{
        complex = read_graph(vertices,edges,filter,dist);
    }
    complex.compute_oldest_cofaces();



    for(int i = 0; i < complex.cells.size(); i++){
        cell_counts.push_back(complex.cells[i].size());
    }
    
    output["cell_counts"] = cell_counts;

    //create tournser object and compute persistent homology
    if (!count_only){
        tournser thetournser = tournser(&complex,filename,max_entries,true);
        thetournser.compute_barcodes();
        output["finite_pairs"] = thetournser.finite_pairs;
        output["infinite_pairs"] = thetournser.infinite_pairs;
        output["bettis"] = thetournser.num_infinite_pairs();
    }
    
 // Re-enable again cout
    std::cout.rdbuf(cout_buff);

    return output;
  });
}